

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCatalog.cpp
# Opt level: O0

void __thiscall psy::C::NameCatalog::markIndexedNodeAsEncloser(NameCatalog *this,SyntaxNode *node)

{
  bool bVar1;
  ostream *poVar2;
  SyntaxNode *local_18;
  SyntaxNode *node_local;
  NameCatalog *this_local;
  
  local_18 = node;
  node_local = (SyntaxNode *)this;
  if (node == (SyntaxNode *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/reparser/NameCatalog.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3f);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,"<empty message>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    bVar1 = isIndexed(this,node);
    if (bVar1) {
      std::
      stack<const_psy::C::SyntaxNode_*,_std::deque<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>_>
      ::push(&this->enclosureStack_,&local_18);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/reparser/NameCatalog.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x40);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::operator<<(poVar2,"<empty message>");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void NameCatalog::markIndexedNodeAsEncloser(const SyntaxNode* node)
{
    PSY_ASSERT_2(node, return);
    PSY_ASSERT_2(isIndexed(node), return);

    enclosureStack_.push(node);
}